

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

void inner_decoder_callback(void *context,AMQP_VALUE decoded_value)

{
  INTERNAL_DECODER_DATA *inner_decoder;
  INTERNAL_DECODER_DATA *internal_decoder_data;
  AMQP_VALUE decoded_value_local;
  void *context_local;
  
  *(undefined4 *)(*(long *)((long)context + 0x28) + 0x18) = 2;
  return;
}

Assistant:

static void inner_decoder_callback(void* context, AMQP_VALUE decoded_value)
{
    /* API issue: the decoded_value should be removed completely:
    TODO: uAMQP: inner_decoder_callback in amqpvalue.c could probably do without the decoded_value ... */
    INTERNAL_DECODER_DATA* internal_decoder_data = (INTERNAL_DECODER_DATA*)context;
    INTERNAL_DECODER_DATA* inner_decoder = (INTERNAL_DECODER_DATA*)internal_decoder_data->inner_decoder;
    (void)decoded_value;
    inner_decoder->decoder_state = DECODER_STATE_DONE;
}